

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::PalRtCommand::PalRtCommand(PalRtCommand *this,int hx,int sx,int yl,int yh)

{
  int yh_local;
  int yl_local;
  int sx_local;
  int hx_local;
  PalRtCommand *this_local;
  
  DrawerCommand::DrawerCommand(&this->super_DrawerCommand);
  (this->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__PalRtCommand_009ebeb0;
  *(int *)&(this->super_DrawerCommand).field_0xc = hx;
  this->sx = sx;
  this->yl = yl;
  this->yh = yh;
  this->_destorg = drawerargs::dc_destorg;
  this->_pitch = drawerargs::dc_pitch;
  this->_colormap = drawerargs::dc_colormap;
  this->_srcblend = drawerargs::dc_srcblend;
  this->_destblend = drawerargs::dc_destblend;
  this->_translation = drawerargs::dc_translation;
  this->_color = drawerargs::dc_color;
  return;
}

Assistant:

PalRtCommand::PalRtCommand(int hx, int sx, int yl, int yh) : hx(hx), sx(sx), yl(yl), yh(yh)
	{
		using namespace drawerargs;
	
		_destorg = dc_destorg;
		_pitch = dc_pitch;
		_colormap = dc_colormap;
		_srcblend = dc_srcblend;
		_destblend = dc_destblend;
		_translation = dc_translation;
		_color = dc_color;
	}